

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall Gluco::vec<double>::clear(vec<double> *this,bool dealloc)

{
  int local_18;
  int i;
  bool dealloc_local;
  vec<double> *this_local;
  
  if (this->data != (double *)0x0) {
    for (local_18 = 0; local_18 < this->sz; local_18 = local_18 + 1) {
    }
    this->sz = 0;
    if (dealloc) {
      free(this->data);
      this->data = (double *)0x0;
      this->cap = 0;
    }
  }
  return;
}

Assistant:

void vec<T>::clear(bool dealloc) {
    if (data != NULL){
        for (int i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) free(data), data = NULL, cap = 0; } }